

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

QpVector * __thiscall MatrixBase::mat_vec_seq(MatrixBase *this,QpVector *other,QpVector *target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  QpVector::reset(target);
  iVar1 = other->num_nz;
  piVar4 = (other->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
    lVar11 = (long)piVar4[lVar10];
    iVar2 = piVar5[lVar11 + 1];
    piVar6 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (other->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = (long)piVar5[lVar11]; lVar12 < iVar2; lVar12 = lVar12 + 1) {
      iVar3 = piVar6[lVar12];
      pdVar9[iVar3] = pdVar7[lVar12] * pdVar8[lVar11] + pdVar9[iVar3];
    }
  }
  QpVector::resparsify(target);
  return target;
}

Assistant:

QpVector& mat_vec_seq(const QpVector& other, QpVector& target) const {
    target.reset();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      HighsInt col = other.index[i];
      for (HighsInt idx = start[col]; idx < start[col + 1]; idx++) {
        HighsInt row = index[idx];
        target.value[row] += value[idx] * other.value[col];
      }
    }
    target.resparsify();
    return target;
  }